

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall
flatbuffers::cpp::CppGenerator::GenTableUnionAsGetters(CppGenerator *this,FieldDef *field)

{
  Namespace *ns;
  bool bVar1;
  vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_> *pvVar2;
  reference ppEVar3;
  char *__rhs;
  allocator<char> local_351;
  string local_350;
  allocator<char> local_329;
  string local_328;
  allocator<char> local_301;
  string local_300;
  string local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  string local_298;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  allocator<char> local_211;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  string local_188;
  string local_168;
  allocator<char> local_141;
  string local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_98 [8];
  string full_struct_name;
  EnumVal *ev;
  __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_68;
  const_iterator u_it;
  allocator<char> local_49;
  string local_48;
  EnumDef *local_28;
  EnumDef *u;
  Type *type;
  FieldDef *field_local;
  CppGenerator *this_local;
  
  u = (EnumDef *)&field->value;
  local_28 = (field->value).type.enum_def;
  type = (Type *)field;
  field_local = (FieldDef *)this;
  if ((((field->value).type.enum_def)->uses_multiple_type_instances & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,
               "  template<typename T> const T *{{NULLABLE_EXT}}{{FIELD_NAME}}_as() const;",
               &local_49);
    CodeWriter::operator+=(&this->code_,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  pvVar2 = EnumDef::Vals(local_28);
  local_68._M_current =
       (EnumVal **)
       std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin(pvVar2);
  while( true ) {
    pvVar2 = EnumDef::Vals(local_28);
    ev = (EnumVal *)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end(pvVar2);
    bVar1 = __gnu_cxx::operator!=
                      (&local_68,
                       (__normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
                        *)&ev);
    if (!bVar1) break;
    ppEVar3 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
              ::operator*(&local_68);
    full_struct_name.field_2._8_8_ = *ppEVar3;
    if ((((EnumVal *)full_struct_name.field_2._8_8_)->union_type).base_type != BASE_TYPE_NONE) {
      GetUnionElement_abi_cxx11_
                ((string *)local_98,this,(EnumVal *)full_struct_name.field_2._8_8_,false,
                 &(this->opts_).super_IDLOptions);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"U_GET_TYPE",&local_b9)
      ;
      Name_abi_cxx11_(&local_120,this,(FieldDef *)type);
      __rhs = UnionTypeFieldSuffix();
      std::operator+(&local_100,&local_120,__rhs);
      EscapeKeyword(&local_e0,this,&local_100);
      CodeWriter::SetValue(&this->code_,&local_b8,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"U_ELEMENT_TYPE",&local_141);
      ns = (local_28->super_Definition).defined_namespace;
      GetEnumValUse_abi_cxx11_(&local_188,this,local_28,(EnumVal *)full_struct_name.field_2._8_8_);
      BaseGenerator::WrapInNameSpace(&local_168,&this->super_BaseGenerator,ns,&local_188);
      CodeWriter::SetValue(&this->code_,&local_140,&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator(&local_141);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,"U_FIELD_TYPE",&local_1a9);
      std::operator+(&local_1f0,"const ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
      std::operator+(&local_1d0,&local_1f0," *");
      CodeWriter::SetValue(&this->code_,&local_1a8,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::allocator<char>::~allocator(&local_1a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_210,"U_FIELD_NAME",&local_211);
      Name_abi_cxx11_(&local_278,this,(FieldDef *)type);
      std::operator+(&local_258,&local_278,"_as_");
      Name_abi_cxx11_(&local_298,this,(EnumVal *)full_struct_name.field_2._8_8_);
      std::operator+(&local_238,&local_258,&local_298);
      CodeWriter::SetValue(&this->code_,&local_210,&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_210);
      std::allocator<char>::~allocator(&local_211);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b8,"U_NULLABLE",&local_2b9);
      NullableExtension_abi_cxx11_(&local_2e0,this);
      CodeWriter::SetValue(&this->code_,&local_2b8,&local_2e0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::allocator<char>::~allocator(&local_2b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_300,"  {{U_FIELD_TYPE}}{{U_NULLABLE}}{{U_FIELD_NAME}}() const {",
                 &local_301);
      CodeWriter::operator+=(&this->code_,&local_300);
      std::__cxx11::string::~string((string *)&local_300);
      std::allocator<char>::~allocator(&local_301);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_328,
                 "    return {{U_GET_TYPE}}() == {{U_ELEMENT_TYPE}} ? static_cast<{{U_FIELD_TYPE}}>({{FIELD_NAME}}()) : nullptr;"
                 ,&local_329);
      CodeWriter::operator+=(&this->code_,&local_328);
      std::__cxx11::string::~string((string *)&local_328);
      std::allocator<char>::~allocator(&local_329);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,"  }",&local_351);
      CodeWriter::operator+=(&this->code_,&local_350);
      std::__cxx11::string::~string((string *)&local_350);
      std::allocator<char>::~allocator(&local_351);
      std::__cxx11::string::~string((string *)local_98);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::EnumVal_*const_*,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
    ::operator++(&local_68);
  }
  return;
}

Assistant:

void GenTableUnionAsGetters(const FieldDef &field) {
    const auto &type = field.value.type;
    auto u = type.enum_def;

    if (!type.enum_def->uses_multiple_type_instances)
      code_ +=
          "  template<typename T> "
          "const T *{{NULLABLE_EXT}}{{FIELD_NAME}}_as() const;";

    for (auto u_it = u->Vals().begin(); u_it != u->Vals().end(); ++u_it) {
      auto &ev = **u_it;
      if (ev.union_type.base_type == BASE_TYPE_NONE) { continue; }
      auto full_struct_name = GetUnionElement(ev, false, opts_);

      // @TODO: Mby make this decisions more universal? How?
      code_.SetValue("U_GET_TYPE",
                     EscapeKeyword(Name(field) + UnionTypeFieldSuffix()));
      code_.SetValue("U_ELEMENT_TYPE", WrapInNameSpace(u->defined_namespace,
                                                       GetEnumValUse(*u, ev)));
      code_.SetValue("U_FIELD_TYPE", "const " + full_struct_name + " *");
      code_.SetValue("U_FIELD_NAME", Name(field) + "_as_" + Name(ev));
      code_.SetValue("U_NULLABLE", NullableExtension());

      // `const Type *union_name_asType() const` accessor.
      code_ += "  {{U_FIELD_TYPE}}{{U_NULLABLE}}{{U_FIELD_NAME}}() const {";
      code_ +=
          "    return {{U_GET_TYPE}}() == {{U_ELEMENT_TYPE}} ? "
          "static_cast<{{U_FIELD_TYPE}}>({{FIELD_NAME}}()) "
          ": nullptr;";
      code_ += "  }";
    }
  }